

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

mz_bool mz_zip_reader_extract_to_callback
                  (mz_zip_archive *pZip,mz_uint file_index,mz_file_write_func pCallback,
                  void *pOpaque,mz_uint flags)

{
  void *pvVar1;
  mz_bool mVar2;
  tinfl_status tVar3;
  size_t sVar4;
  mz_uint8 *pOut_buf_start;
  size_t sVar5;
  size_t sVar6;
  mz_ulong mVar7;
  ulong uVar8;
  mz_uint64 mVar9;
  ulong uVar10;
  mz_uint8 *pOut_buf_next;
  bool bVar11;
  mz_uint8 *ptr;
  long lVar12;
  size_t out_buf_size;
  size_t in_buf_size;
  mz_uint32 local_header_u32 [8];
  mz_zip_archive_file_stat file_stat;
  tinfl_decompressor inflator;
  ulong local_2e08;
  mz_uint64 local_2df8;
  ulong local_2dd8;
  size_t local_2dc0;
  size_t local_2db8;
  size_t local_2db0;
  ulong local_2da8;
  long local_2da0;
  int local_2d98 [6];
  ushort local_2d7e;
  ushort local_2d7c;
  mz_zip_archive_file_stat local_2d70;
  tinfl_decompressor local_2b28;
  
  mVar2 = mz_zip_reader_file_stat(pZip,file_index,&local_2d70);
  if (mVar2 != 0) {
    bVar11 = true;
    if ((local_2d70.m_comp_size == 0) ||
       (mVar2 = mz_zip_reader_is_file_a_directory(pZip,file_index), mVar2 != 0)) goto LAB_00192df7;
    if ((((byte)local_2d70.m_bit_flag & 0x21) == 0) &&
       (((flags >> 10 & 1) != 0 || ((local_2d70.m_method & 0xfff7) == 0)))) {
      sVar4 = (*pZip->m_pRead)(pZip->m_pIO_opaque,local_2d70.m_local_header_ofs,local_2d98,0x1e);
      bVar11 = false;
      if ((sVar4 != 0x1e) || (bVar11 = false, local_2d98[0] != 0x4034b50)) goto LAB_00192df7;
      if (local_2d70.m_local_header_ofs + local_2d7e + (ulong)local_2d7c + local_2d70.m_comp_size +
          0x1e <= pZip->m_archive_size) {
        local_2df8 = (ulong)local_2d7c + local_2d70.m_local_header_ofs + local_2d7e + 0x1e;
        pvVar1 = pZip->m_pState->m_pMem;
        if (pvVar1 == (void *)0x0) {
          local_2dd8 = 0x10000;
          if (local_2d70.m_comp_size < 0x10000) {
            local_2dd8 = local_2d70.m_comp_size;
          }
          ptr = (mz_uint8 *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,local_2dd8);
          if (ptr == (mz_uint8 *)0x0) goto LAB_00192df4;
          mVar9 = 0;
          uVar8 = local_2d70.m_comp_size;
        }
        else {
          ptr = (mz_uint8 *)((long)pvVar1 + local_2df8);
          local_2dd8 = local_2d70.m_comp_size;
          mVar9 = local_2d70.m_comp_size;
          uVar8 = 0;
        }
        if (((flags >> 10 & 1) == 0) && (local_2d70.m_method != 0)) {
          local_2b28.m_state = 0;
          pOut_buf_start = (mz_uint8 *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,0x8000);
          if (pOut_buf_start == (mz_uint8 *)0x0) {
LAB_001931be:
            bVar11 = false;
          }
          else {
            local_2e08 = 0;
            lVar12 = 0;
            sVar4 = 0;
            do {
              uVar10 = (ulong)((uint)sVar4 & 0x7fff);
              local_2dc0 = 0x8000 - uVar10;
              if (mVar9 == 0) {
                if (pZip->m_pState->m_pMem == (void *)0x0) {
                  mVar9 = uVar8;
                  if (local_2dd8 < uVar8) {
                    mVar9 = local_2dd8;
                  }
                  sVar5 = (*pZip->m_pRead)(pZip->m_pIO_opaque,local_2df8,ptr,mVar9);
                  if (sVar5 != mVar9) goto LAB_001931be;
                  local_2df8 = local_2df8 + mVar9;
                  uVar8 = uVar8 - mVar9;
                  lVar12 = 0;
                }
                else {
                  mVar9 = 0;
                }
              }
              pOut_buf_next = pOut_buf_start + uVar10;
              local_2db8 = mVar9;
              tVar3 = tinfl_decompress(&local_2b28,ptr + lVar12,&local_2db8,pOut_buf_start,
                                       pOut_buf_next,&local_2dc0,(uint)(uVar8 != 0) * 2);
              sVar5 = local_2dc0;
              if (local_2dc0 == 0) {
                bVar11 = true;
                sVar5 = local_2db8;
              }
              else {
                local_2db0 = local_2db8;
                local_2da8 = (ulong)(uint)tVar3;
                local_2da0 = lVar12;
                sVar6 = (*pCallback)(pOpaque,sVar4,pOut_buf_next,local_2dc0);
                if (sVar6 != sVar5) goto LAB_001931be;
                local_2e08 = mz_crc32(local_2e08 & 0xffffffff,pOut_buf_next,sVar5);
                sVar4 = sVar4 + sVar5;
                bVar11 = sVar4 <= local_2d70.m_uncomp_size;
                tVar3 = (tinfl_status)local_2da8;
                sVar5 = local_2db0;
                lVar12 = local_2da0;
                if (local_2d70.m_uncomp_size < sVar4) {
                  tVar3 = TINFL_STATUS_FAILED;
                }
              }
              if (!bVar11) break;
              mVar9 = mVar9 - sVar5;
              lVar12 = lVar12 + sVar5;
            } while ((uint)(tVar3 + TINFL_STATUS_FAILED) < 2);
            if (tVar3 == TINFL_STATUS_DONE) goto LAB_001931d6;
            bVar11 = false;
          }
        }
        else if (pZip->m_pState->m_pMem == (void *)0x0) {
          if (uVar8 == 0) {
            pOut_buf_start = (mz_uint8 *)0x0;
            sVar4 = 0;
            local_2e08._0_4_ = 0;
          }
          else {
            sVar4 = 0;
            local_2e08 = 0;
            do {
              uVar10 = uVar8;
              if (local_2dd8 < uVar8) {
                uVar10 = local_2dd8;
              }
              sVar5 = (*pZip->m_pRead)(pZip->m_pIO_opaque,local_2df8,ptr,uVar10);
              if (sVar5 != uVar10) {
LAB_001931bb:
                pOut_buf_start = (mz_uint8 *)0x0;
                goto LAB_001931be;
              }
              if ((flags >> 10 & 1) == 0) {
                local_2e08 = mz_crc32(local_2e08 & 0xffffffff,ptr,uVar10);
              }
              sVar5 = (*pCallback)(pOpaque,sVar4,ptr,uVar10);
              if (sVar5 != uVar10) goto LAB_001931bb;
              local_2df8 = local_2df8 + uVar10;
              sVar4 = sVar4 + uVar10;
              uVar8 = uVar8 - uVar10;
            } while (uVar8 != 0);
            pOut_buf_start = (mz_uint8 *)0x0;
          }
LAB_001931d6:
          bVar11 = true;
          if ((flags >> 10 & 1) == 0) {
LAB_001931df:
            bVar11 = (mz_uint32)local_2e08 == local_2d70.m_crc32 &&
                     sVar4 == local_2d70.m_uncomp_size;
          }
        }
        else {
          pOut_buf_start = (mz_uint8 *)0x0;
          sVar4 = (*pCallback)(pOpaque,0,ptr,local_2d70.m_comp_size);
          bVar11 = sVar4 == local_2d70.m_comp_size;
          if (((flags >> 10 & 1) == 0) && (sVar4 == local_2d70.m_comp_size)) {
            pOut_buf_start = (mz_uint8 *)0x0;
            mVar7 = mz_crc32(0,ptr,sVar4);
            local_2e08._0_4_ = (mz_uint32)mVar7;
            goto LAB_001931df;
          }
        }
        if (pZip->m_pState->m_pMem == (void *)0x0) {
          (*pZip->m_pFree)(pZip->m_pAlloc_opaque,ptr);
        }
        if (pOut_buf_start != (mz_uint8 *)0x0) {
          (*pZip->m_pFree)(pZip->m_pAlloc_opaque,pOut_buf_start);
        }
        goto LAB_00192df7;
      }
    }
  }
LAB_00192df4:
  bVar11 = false;
LAB_00192df7:
  return (mz_bool)bVar11;
}

Assistant:

mz_bool mz_zip_reader_extract_to_callback(mz_zip_archive *pZip,
                                          mz_uint file_index,
                                          mz_file_write_func pCallback,
                                          void *pOpaque, mz_uint flags) {
  int status = TINFL_STATUS_DONE;
  mz_uint file_crc32 = MZ_CRC32_INIT;
  mz_uint64 read_buf_size, read_buf_ofs = 0, read_buf_avail, comp_remaining,
                           out_buf_ofs = 0, cur_file_ofs;
  mz_zip_archive_file_stat file_stat;
  void *pRead_buf = NULL;
  void *pWrite_buf = NULL;
  mz_uint32
      local_header_u32[(MZ_ZIP_LOCAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) /
                       sizeof(mz_uint32)];
  mz_uint8 *pLocal_header = (mz_uint8 *)local_header_u32;

  if (!mz_zip_reader_file_stat(pZip, file_index, &file_stat))
    return MZ_FALSE;

  // Empty file, or a directory (but not always a directory - I've seen odd zips
  // with directories that have compressed data which inflates to 0 bytes)
  if (!file_stat.m_comp_size)
    return MZ_TRUE;

  // Entry is a subdirectory (I've seen old zips with dir entries which have
  // compressed deflate data which inflates to 0 bytes, but these entries claim
  // to uncompress to 512 bytes in the headers).
  // I'm torn how to handle this case - should it fail instead?
  if (mz_zip_reader_is_file_a_directory(pZip, file_index))
    return MZ_TRUE;

  // Encryption and patch files are not supported.
  if (file_stat.m_bit_flag & (1 | 32))
    return MZ_FALSE;

  // This function only supports stored and deflate.
  if ((!(flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) && (file_stat.m_method != 0) &&
      (file_stat.m_method != MZ_DEFLATED))
    return MZ_FALSE;

  // Read and parse the local directory entry.
  cur_file_ofs = file_stat.m_local_header_ofs;
  if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pLocal_header,
                    MZ_ZIP_LOCAL_DIR_HEADER_SIZE) !=
      MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
    return MZ_FALSE;
  if (MZ_READ_LE32(pLocal_header) != MZ_ZIP_LOCAL_DIR_HEADER_SIG)
    return MZ_FALSE;

  cur_file_ofs += MZ_ZIP_LOCAL_DIR_HEADER_SIZE +
                  MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_FILENAME_LEN_OFS) +
                  MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_EXTRA_LEN_OFS);
  if ((cur_file_ofs + file_stat.m_comp_size) > pZip->m_archive_size)
    return MZ_FALSE;

  // Decompress the file either directly from memory or from a file input
  // buffer.
  if (pZip->m_pState->m_pMem) {
    pRead_buf = (mz_uint8 *)pZip->m_pState->m_pMem + cur_file_ofs;
    read_buf_size = read_buf_avail = file_stat.m_comp_size;
    comp_remaining = 0;
  } else {
    read_buf_size = MZ_MIN(file_stat.m_comp_size, MZ_ZIP_MAX_IO_BUF_SIZE);
    if (NULL == (pRead_buf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1,
                                            (size_t)read_buf_size)))
      return MZ_FALSE;
    read_buf_avail = 0;
    comp_remaining = file_stat.m_comp_size;
  }

  if ((flags & MZ_ZIP_FLAG_COMPRESSED_DATA) || (!file_stat.m_method)) {
    // The file is stored or the caller has requested the compressed data.
    if (pZip->m_pState->m_pMem) {
#ifdef _MSC_VER
      if (((0, sizeof(size_t) == sizeof(mz_uint32))) &&
          (file_stat.m_comp_size > 0xFFFFFFFF))
#else
      if (((sizeof(size_t) == sizeof(mz_uint32))) &&
          (file_stat.m_comp_size > 0xFFFFFFFF))
#endif
        return MZ_FALSE;
      if (pCallback(pOpaque, out_buf_ofs, pRead_buf,
                    (size_t)file_stat.m_comp_size) != file_stat.m_comp_size)
        status = TINFL_STATUS_FAILED;
      else if (!(flags & MZ_ZIP_FLAG_COMPRESSED_DATA))
        file_crc32 =
            (mz_uint32)mz_crc32(file_crc32, (const mz_uint8 *)pRead_buf,
                                (size_t)file_stat.m_comp_size);
      cur_file_ofs += file_stat.m_comp_size;
      out_buf_ofs += file_stat.m_comp_size;
      comp_remaining = 0;
    } else {
      while (comp_remaining) {
        read_buf_avail = MZ_MIN(read_buf_size, comp_remaining);
        if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pRead_buf,
                          (size_t)read_buf_avail) != read_buf_avail) {
          status = TINFL_STATUS_FAILED;
          break;
        }

        if (!(flags & MZ_ZIP_FLAG_COMPRESSED_DATA))
          file_crc32 = (mz_uint32)mz_crc32(
              file_crc32, (const mz_uint8 *)pRead_buf, (size_t)read_buf_avail);

        if (pCallback(pOpaque, out_buf_ofs, pRead_buf,
                      (size_t)read_buf_avail) != read_buf_avail) {
          status = TINFL_STATUS_FAILED;
          break;
        }
        cur_file_ofs += read_buf_avail;
        out_buf_ofs += read_buf_avail;
        comp_remaining -= read_buf_avail;
      }
    }
  } else {
    tinfl_decompressor inflator;
    tinfl_init(&inflator);

    if (NULL == (pWrite_buf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1,
                                             TINFL_LZ_DICT_SIZE)))
      status = TINFL_STATUS_FAILED;
    else {
      do {
        mz_uint8 *pWrite_buf_cur =
            (mz_uint8 *)pWrite_buf + (out_buf_ofs & (TINFL_LZ_DICT_SIZE - 1));
        size_t in_buf_size,
            out_buf_size =
                TINFL_LZ_DICT_SIZE - (out_buf_ofs & (TINFL_LZ_DICT_SIZE - 1));
        if ((!read_buf_avail) && (!pZip->m_pState->m_pMem)) {
          read_buf_avail = MZ_MIN(read_buf_size, comp_remaining);
          if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pRead_buf,
                            (size_t)read_buf_avail) != read_buf_avail) {
            status = TINFL_STATUS_FAILED;
            break;
          }
          cur_file_ofs += read_buf_avail;
          comp_remaining -= read_buf_avail;
          read_buf_ofs = 0;
        }

        in_buf_size = (size_t)read_buf_avail;
        status = tinfl_decompress(
            &inflator, (const mz_uint8 *)pRead_buf + read_buf_ofs, &in_buf_size,
            (mz_uint8 *)pWrite_buf, pWrite_buf_cur, &out_buf_size,
            comp_remaining ? TINFL_FLAG_HAS_MORE_INPUT : 0);
        read_buf_avail -= in_buf_size;
        read_buf_ofs += in_buf_size;

        if (out_buf_size) {
          if (pCallback(pOpaque, out_buf_ofs, pWrite_buf_cur, out_buf_size) !=
              out_buf_size) {
            status = TINFL_STATUS_FAILED;
            break;
          }
          file_crc32 =
              (mz_uint32)mz_crc32(file_crc32, pWrite_buf_cur, out_buf_size);
          if ((out_buf_ofs += out_buf_size) > file_stat.m_uncomp_size) {
            status = TINFL_STATUS_FAILED;
            break;
          }
        }
      } while ((status == TINFL_STATUS_NEEDS_MORE_INPUT) ||
               (status == TINFL_STATUS_HAS_MORE_OUTPUT));
    }
  }

  if ((status == TINFL_STATUS_DONE) &&
      (!(flags & MZ_ZIP_FLAG_COMPRESSED_DATA))) {
    // Make sure the entire file was decompressed, and check its CRC.
    if ((out_buf_ofs != file_stat.m_uncomp_size) ||
        (file_crc32 != file_stat.m_crc32))
      status = TINFL_STATUS_FAILED;
  }

  if (!pZip->m_pState->m_pMem)
    pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
  if (pWrite_buf)
    pZip->m_pFree(pZip->m_pAlloc_opaque, pWrite_buf);

  return status == TINFL_STATUS_DONE;
}